

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# our_gl.cpp
# Opt level: O3

vec3f * barycentric(vec3f *__return_storage_ptr__,vec2f A,vec2f B,vec2f C,vec2f P)

{
  double dVar1;
  double dVar2;
  double dVar5;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  
  dVar2 = A.y;
  dVar5 = A.x;
  dVar8 = C.y - dVar2;
  dVar9 = C.x - dVar5;
  dVar6 = B.y - dVar2;
  dVar7 = B.x - dVar5;
  dVar1 = dVar9 * dVar6 - dVar7 * dVar8;
  if (ABS(dVar1) <= 0.01) {
    dVar5 = -1.0;
    auVar4 = _DAT_00107040;
  }
  else {
    dVar2 = dVar2 - P.y;
    dVar5 = dVar5 - P.x;
    auVar3._0_8_ = dVar5 * dVar8 - dVar2 * dVar9;
    auVar3._8_8_ = dVar2 * dVar7 - dVar6 * dVar5;
    dVar5 = 1.0 - (auVar3._8_8_ + auVar3._0_8_) / dVar1;
    auVar4._8_8_ = dVar1;
    auVar4._0_8_ = dVar1;
    auVar4 = divpd(auVar3,auVar4);
  }
  __return_storage_ptr__->x = dVar5;
  __return_storage_ptr__->y = (double)auVar4._0_8_;
  __return_storage_ptr__->z = (double)auVar4._8_8_;
  return __return_storage_ptr__;
}

Assistant:

vec3f barycentric(vec2f A, vec2f B, vec2f C, vec2f P)
{
    vec3f s[2];
    for (int i = 2; i--;) {
        s[i][0] = C[i] - A[i];
        s[i][1] = B[i] - A[i];
        s[i][2] = A[i] - P[i];
    }
    vec3f u = cross(s[0], s[1]);
    if (std::abs(u[2]) >
        1e-2)  // dont forget that u[2] is integer. If it is zero then triangle ABC is degenerate
        return vec3f(1.f - (u.x + u.y) / u.z, u.y / u.z, u.x / u.z);
    return vec3f(-1, 1, 1);  // in this case generate negative coordinates, it will be thrown away
                             // by the rasterizer
}